

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

void __thiscall
capnp::compiler::NodeTranslator::StructTranslator::translateInternal
          (StructTranslator *this,MemberInfo *root,Builder builder)

{
  Which WVar1;
  MemberInfo *pMVar2;
  Union *pUVar3;
  ErrorReporter *pEVar4;
  MemberInfo **ppMVar5;
  AuxNode *pAVar6;
  Reader ordinal;
  Reader source;
  Reader type;
  Builder target;
  Builder target_00;
  Reader type_00;
  Builder target_01;
  _Rb_tree_color _Var7;
  SegmentBuilder *pSVar8;
  CapTableBuilder *pCVar9;
  WirePointer *pWVar10;
  void *pvVar11;
  bool bVar12;
  uint uVar13;
  uint32_t uVar14;
  StructReader *pSVar15;
  _Base_ptr p_Var16;
  StructBuilder *pSVar17;
  ulong uVar18;
  AuxNode *group;
  MemberInfo **ppMVar19;
  AuxNode *this_00;
  char *pcVar20;
  ulong uVar21;
  undefined8 uVar22;
  NodeTranslator *pNVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  StringPtr targetsFlagName;
  Reader RVar28;
  Fault f;
  anon_class_8_1_60e67bd8 _kjContextFunc1389;
  Builder typeBuilder;
  Builder fieldBuilder;
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_node_translator_c__:1389:7)>
  _kjContext1389;
  DuplicateOrdinalDetector dupDetector;
  StructReader local_378;
  PointerReader local_348;
  WirePointer *local_328;
  MemberInfo *local_320;
  StructBuilder local_318;
  Builder local_2e8;
  void *local_2b8;
  MemberInfo *local_2b0;
  ImplicitParams *local_2a8;
  _Rb_tree_node_base *local_2a0;
  undefined1 local_298 [24];
  WirePointer *local_280;
  MemberInfo **local_250;
  SegmentReader *local_248;
  CapTableReader *pCStack_240;
  void *local_238;
  WirePointer *pWStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  Maybe<capnp::Schema> local_218;
  StructBuilder local_208;
  undefined1 local_1e0 [144];
  ArrayDisposer *pAStack_150;
  AuxNode *local_148;
  RemoveConst<capnp::compiler::NodeTranslator::AuxNode> *pRStack_140;
  AuxNode *local_138;
  ArrayDisposer *pAStack_130;
  DuplicateOrdinalDetector local_128;
  StructBuilder local_e0;
  undefined1 local_b8 [88];
  StructReader local_60;
  
  *(undefined4 *)((long)builder._builder.data + 0xc) = 1;
  *(undefined4 *)((long)builder._builder.data + 0x18) = 0;
  *(byte *)((long)builder._builder.data + 0x1c) =
       *(byte *)((long)builder._builder.data + 0x1c) & 0xfe;
  *(undefined2 *)((long)builder._builder.data + 0x1e) = 0;
  local_2b8 = builder._builder.data;
  *(undefined4 *)((long)builder._builder.data + 0x20) = 0;
  local_298._16_8_ = builder._builder.pointers + 3;
  local_298._0_8_ = builder._builder.segment;
  local_298._8_8_ = builder._builder.capTable;
  local_2b0 = root;
  capnp::_::PointerBuilder::clear((PointerBuilder *)local_298);
  local_128.errorReporter = this->errorReporter;
  local_128.expectedOrdinal = 0;
  local_128.lastOrdinalLocation.ptr.isSet = false;
  p_Var16 = (this->membersByOrdinal)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_2a0 = &(this->membersByOrdinal)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var16 != local_2a0) {
    local_2a8 = &this->implicitMethodParams;
    do {
      pMVar2 = (MemberInfo *)p_Var16[1]._M_parent;
      local_320 = pMVar2;
      kj::_::Debug::Context::Context((Context *)local_298);
      local_298._0_8_ = &PTR__Context_0027d330;
      local_250 = &local_320;
      if ((0xf < (pMVar2->declId)._reader.dataSize) && (*(pMVar2->declId)._reader.data == 2)) {
        if ((pMVar2->declId)._reader.pointerCount < 2) {
          uVar24 = 0;
          uVar25 = 0;
          uVar26 = 0;
          uVar27 = 0;
          local_378.pointers._0_4_ = 0x7fffffff;
          local_378.data = (WirePointer *)0x0;
        }
        else {
          uVar24 = *(undefined4 *)&(pMVar2->declId)._reader.segment;
          uVar25 = *(undefined4 *)((long)&(pMVar2->declId)._reader.segment + 4);
          uVar26 = *(undefined4 *)&(pMVar2->declId)._reader.capTable;
          uVar27 = *(undefined4 *)((long)&(pMVar2->declId)._reader.capTable + 4);
          local_378.data = (pMVar2->declId)._reader.pointers + 1;
          local_378.pointers._0_4_ = (pMVar2->declId)._reader.nestingLimit;
        }
        local_378.segment = (SegmentReader *)CONCAT44(uVar25,uVar24);
        local_378.capTable = (CapTableReader *)CONCAT44(uVar27,uVar26);
        capnp::_::PointerReader::getStruct
                  ((StructReader *)(local_1e0 + 0x88),(PointerReader *)&local_378,(word *)0x0);
        ordinal._reader.capTable = (CapTableReader *)pAStack_150;
        ordinal._reader.segment = (SegmentReader *)local_1e0._136_8_;
        ordinal._reader.data = local_148;
        ordinal._reader.pointers = (WirePointer *)pRStack_140;
        ordinal._reader._32_8_ = local_138;
        ordinal._reader._40_8_ = pAStack_130;
        DuplicateOrdinalDetector::check(&local_128,ordinal);
      }
      MemberInfo::getSchema(&local_2e8,pMVar2);
      _Var7 = p_Var16[1]._M_color;
      *(undefined2 *)
       ((long)&(((WirePointer *)((long)local_2e8._builder.data + 8))->offsetAndKind).value + 2) = 1;
      (((WirePointer *)((long)local_2e8._builder.data + 8))->field_1).structRef.dataSize.value =
           (short)_Var7;
      WVar1 = pMVar2->declKind;
      if (WVar1 != FIELD) {
        if (WVar1 != UNION) {
          if (WVar1 == GROUP) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[28]>
                      ((Fault *)&local_378,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                       ,0x5c8,FAILED,(char *)0x0,"\"Groups don\'t have ordinals.\"",
                       (char (*) [28])"Groups don\'t have ordinals.");
            kj::_::Debug::Fault::fatal((Fault *)&local_378);
          }
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                    ((Fault *)&local_378,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                     ,0x5cc,FAILED,(char *)0x0,"\"Unexpected member type.\"",
                     (char (*) [24])"Unexpected member type.");
          kj::_::Debug::Fault::fatal((Fault *)&local_378);
        }
        pUVar3 = (pMVar2->field_21).unionScope;
        if ((pUVar3->discriminantOffset).ptr.isSet == false) {
          uVar13 = (*pUVar3->parent->_vptr_StructOrGroup[1])(pUVar3->parent,4);
          (pUVar3->discriminantOffset).ptr.field_1.value = uVar13;
          (pUVar3->discriminantOffset).ptr.isSet = true;
        }
        else {
          if ((pMVar2->declId)._reader.pointerCount < 2) {
            local_318.segment._0_4_ = 0;
            local_318.segment._4_4_ = 0;
            local_318.capTable._0_4_ = 0;
            local_318.capTable._4_4_ = 0;
            local_318.pointers._0_4_ = 0x7fffffff;
            local_318.data = (WirePointer *)0x0;
          }
          else {
            local_318.segment._0_4_ = *(undefined4 *)&(pMVar2->declId)._reader.segment;
            local_318.segment._4_4_ = *(undefined4 *)((long)&(pMVar2->declId)._reader.segment + 4);
            local_318.capTable._0_4_ = *(undefined4 *)&(pMVar2->declId)._reader.capTable;
            local_318.capTable._4_4_ = *(undefined4 *)((long)&(pMVar2->declId)._reader.capTable + 4)
            ;
            local_318.data = (pMVar2->declId)._reader.pointers + 1;
            local_318.pointers._0_4_ = (pMVar2->declId)._reader.nestingLimit;
          }
          pEVar4 = this->errorReporter;
          capnp::_::PointerReader::getStruct(&local_378,(PointerReader *)&local_318,(word *)0x0);
          uVar18 = 0;
          if (local_378.dataSize < 0x60) {
            uVar21 = 0;
          }
          else {
            uVar21 = (ulong)(((WirePointer *)((long)local_378.data + 8))->offsetAndKind).value;
            if (0x7f < local_378.dataSize) {
              uVar18 = (ulong)(((WirePointer *)((long)local_378.data + 8))->field_1).upper32Bits;
            }
          }
          (**pEVar4->_vptr_ErrorReporter)(pEVar4,uVar21,uVar18);
        }
        goto LAB_0016bb09;
      }
      *(undefined2 *)&(((WirePointer *)((long)local_2e8._builder.data + 8))->offsetAndKind).value =
           0;
      ((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)local_2e8._builder.data + 4))->
      upper32Bits = 0;
      *(byte *)&(((WirePointer *)((long)local_2e8._builder.data + 0x10))->offsetAndKind).value =
           (byte)(((WirePointer *)((long)local_2e8._builder.data + 0x10))->offsetAndKind).value &
           0xfe;
      local_378.data = local_2e8._builder.pointers + 2;
      local_378.segment = &(local_2e8._builder.segment)->super_SegmentReader;
      local_378.capTable = &(local_2e8._builder.capTable)->super_CapTableReader;
      capnp::_::PointerBuilder::clear((PointerBuilder *)&local_378);
      local_378.data = local_2e8._builder.pointers + 3;
      local_378.segment = &(local_2e8._builder.segment)->super_SegmentReader;
      local_378.capTable = &(local_2e8._builder.capTable)->super_CapTableReader;
      capnp::_::PointerBuilder::clear((PointerBuilder *)&local_378);
      pWVar10 = local_2e8._builder.pointers;
      pCVar9 = local_2e8._builder.capTable;
      pSVar8 = local_2e8._builder.segment;
      local_328 = (WirePointer *)local_2e8._builder.data;
      local_378.data = local_2e8._builder.pointers + 2;
      local_378.segment = &(local_2e8._builder.segment)->super_SegmentReader;
      local_378.capTable = &(local_2e8._builder.capTable)->super_CapTableReader;
      capnp::_::PointerBuilder::initStruct
                (&local_318,(PointerBuilder *)&local_378,(StructSize)0x10003);
      target._builder.segment._4_4_ = local_318.segment._4_4_;
      target._builder.segment._0_4_ = local_318.segment._0_4_;
      target._builder.capTable._4_4_ = local_318.capTable._4_4_;
      target._builder.capTable._0_4_ = local_318.capTable._0_4_;
      target._builder.pointers._4_4_ = local_318.pointers._4_4_;
      target._builder.pointers._0_4_ = (int)local_318.pointers;
      target._builder.data = local_318.data;
      target._builder.dataSize = local_318.dataSize;
      target._builder.pointerCount = local_318.pointerCount;
      target._builder._38_2_ = local_318._38_2_;
      bVar12 = compileType(this->translator,(Reader)(pMVar2->fieldType)._reader,target,*local_2a8);
      if (bVar12) {
        if (pMVar2->hasDefaultValue != true) {
          capnp::_::StructBuilder::asReader(&local_318);
          local_378.data = pWVar10 + 3;
          local_378.segment = &pSVar8->super_SegmentReader;
          local_378.capTable = &pCVar9->super_CapTableReader;
          pNVar23 = (NodeTranslator *)local_b8;
          capnp::_::PointerBuilder::initStruct
                    ((StructBuilder *)pNVar23,(PointerBuilder *)&local_378,(StructSize)0x10002);
          pSVar15 = &local_60;
          pSVar17 = (StructBuilder *)local_b8;
          goto LAB_0016b87c;
        }
        if (((pMVar2->isParam == true) && (0xf < (pMVar2->fieldDefaultValue)._reader.dataSize)) &&
           (*(pMVar2->fieldDefaultValue)._reader.data == 5)) {
          if ((pMVar2->fieldDefaultValue)._reader.pointerCount == 0) {
            local_348.segment._0_4_ = 0;
            local_348.segment._4_4_ = 0;
            local_348.capTable._0_4_ = 0;
            local_348.capTable._4_4_ = 0;
            local_348.nestingLimit = 0x7fffffff;
            local_348.pointer = (WirePointer *)0x0;
          }
          else {
            local_348.segment._0_4_ = *(undefined4 *)&(pMVar2->fieldDefaultValue)._reader.segment;
            local_348.segment._4_4_ =
                 *(undefined4 *)((long)&(pMVar2->fieldDefaultValue)._reader.segment + 4);
            local_348.capTable._0_4_ = *(undefined4 *)&(pMVar2->fieldDefaultValue)._reader.capTable;
            local_348.capTable._4_4_ =
                 *(undefined4 *)((long)&(pMVar2->fieldDefaultValue)._reader.capTable + 4);
            local_348.pointer = (pMVar2->fieldDefaultValue)._reader.pointers;
            local_348.nestingLimit = (pMVar2->fieldDefaultValue)._reader.nestingLimit;
          }
          capnp::_::PointerReader::getStruct(&local_378,&local_348,(word *)0x0);
          local_348.pointer =
               (WirePointer *)CONCAT44(local_378.pointers._4_4_,(int)local_378.pointers);
          local_348.nestingLimit = local_378.nestingLimit;
          if (local_378.pointerCount == 0) {
            local_348.pointer = (WirePointer *)0x0;
            local_348.nestingLimit = 0x7fffffff;
          }
          local_348.segment._0_4_ = 0;
          local_348.segment._4_4_ = 0;
          local_348.capTable._0_4_ = 0;
          local_348.capTable._4_4_ = 0;
          if (local_378.pointerCount != 0) {
            local_348.segment._0_4_ = local_378.segment._0_4_;
            local_348.segment._4_4_ = local_378.segment._4_4_;
            local_348.capTable._0_4_ = local_378.capTable._0_4_;
            local_348.capTable._4_4_ = local_378.capTable._4_4_;
          }
          RVar28 = capnp::_::PointerReader::getBlob<capnp::Text>(&local_348,(void *)0x0,0);
          if ((RVar28.super_StringPtr.content.size_ != 5) ||
             ((char)RVar28.super_StringPtr.content.ptr[1] != '\0' ||
              *RVar28.super_StringPtr.content.ptr != 0x6c6c756e)) goto LAB_0016b962;
          uVar13 = (uint)(ushort)((WireValue<uint32_t> *)local_318.data)->value;
          if ((0x12 < uVar13) || ((0x77000U >> (uVar13 & 0x1f) & 1) == 0)) {
            if ((pMVar2->fieldDefaultValue)._reader.pointerCount == 0) {
              local_348.segment._0_4_ = 0;
              local_348.segment._4_4_ = 0;
              local_348.capTable._0_4_ = 0;
              local_348.capTable._4_4_ = 0;
              local_348.nestingLimit = 0x7fffffff;
              local_348.pointer = (WirePointer *)0x0;
            }
            else {
              local_348.segment._0_4_ = *(undefined4 *)&(pMVar2->fieldDefaultValue)._reader.segment;
              local_348.segment._4_4_ =
                   *(undefined4 *)((long)&(pMVar2->fieldDefaultValue)._reader.segment + 4);
              local_348.capTable._0_4_ =
                   *(undefined4 *)&(pMVar2->fieldDefaultValue)._reader.capTable;
              local_348.capTable._4_4_ =
                   *(undefined4 *)((long)&(pMVar2->fieldDefaultValue)._reader.capTable + 4);
              local_348.pointer = (pMVar2->fieldDefaultValue)._reader.pointers;
              local_348.nestingLimit = (pMVar2->fieldDefaultValue)._reader.nestingLimit;
            }
            pEVar4 = this->errorReporter;
            capnp::_::PointerReader::getStruct(&local_378,&local_348,(word *)0x0);
            uVar18 = 0;
            if (local_378.dataSize < 0x20) {
              uVar21 = 0;
            }
            else {
              uVar21 = (ulong)((WireValue<uint32_t> *)local_378.data)->value;
              if (0x3f < local_378.dataSize) {
                uVar18 = (ulong)((anon_union_4_5_35ddcec3_for_WirePointer_1 *)
                                ((long)local_378.data + 4))->upper32Bits;
              }
            }
            (**pEVar4->_vptr_ErrorReporter)(pEVar4,uVar21,uVar18);
          }
          capnp::_::StructBuilder::asReader(&local_318);
          local_378.data = pWVar10 + 3;
          local_378.segment = &pSVar8->super_SegmentReader;
          local_378.capTable = &pCVar9->super_CapTableReader;
          pNVar23 = (NodeTranslator *)local_1e0;
          capnp::_::PointerBuilder::initStruct
                    ((StructBuilder *)pNVar23,(PointerBuilder *)&local_378,(StructSize)0x10002);
          type._reader.capTable = (CapTableReader *)local_1e0._96_8_;
          type._reader.segment = (SegmentReader *)local_1e0._88_8_;
          type._reader.data = (void *)local_1e0._104_8_;
          type._reader.pointers = (WirePointer *)local_1e0._112_8_;
          type._reader.dataSize = local_1e0._120_4_;
          type._reader.pointerCount = local_1e0._124_2_;
          type._reader._38_2_ = local_1e0._126_2_;
          type._reader._40_8_ = local_1e0._128_8_;
          target_00._builder.capTable = (CapTableBuilder *)local_1e0._8_8_;
          target_00._builder.segment = (SegmentBuilder *)local_1e0._0_8_;
          target_00._builder.data = (void *)local_1e0._16_8_;
          target_00._builder.pointers = (WirePointer *)local_1e0._24_8_;
          target_00._builder.dataSize = local_1e0._32_4_;
          target_00._builder.pointerCount = local_1e0._36_2_;
          target_00._builder._38_2_ = local_1e0._38_2_;
          compileDefaultDefaultValue(pNVar23,type,target_00);
        }
        else {
LAB_0016b962:
          pNVar23 = this->translator;
          local_248 = (pMVar2->fieldDefaultValue)._reader.segment;
          pCStack_240 = (pMVar2->fieldDefaultValue)._reader.capTable;
          local_238 = (pMVar2->fieldDefaultValue)._reader.data;
          pWStack_230 = (pMVar2->fieldDefaultValue)._reader.pointers;
          local_228._0_4_ = (pMVar2->fieldDefaultValue)._reader.dataSize;
          local_228._4_2_ = (pMVar2->fieldDefaultValue)._reader.pointerCount;
          local_228._6_2_ = *(undefined2 *)&(pMVar2->fieldDefaultValue)._reader.field_0x26;
          uStack_220 = *(undefined8 *)&(pMVar2->fieldDefaultValue)._reader.nestingLimit;
          capnp::_::StructBuilder::asReader(&local_318);
          local_378.data = pWVar10 + 3;
          local_378.segment = &pSVar8->super_SegmentReader;
          local_378.capTable = &pCVar9->super_CapTableReader;
          capnp::_::PointerBuilder::initStruct
                    (&local_208,(PointerBuilder *)&local_378,(StructSize)0x10002);
          local_218.ptr.isSet = false;
          source._reader.capTable = pCStack_240;
          source._reader.segment = local_248;
          source._reader.data = local_238;
          source._reader.pointers = pWStack_230;
          source._reader.dataSize = (undefined4)local_228;
          source._reader.pointerCount = local_228._4_2_;
          source._reader._38_2_ = local_228._6_2_;
          source._reader._40_8_ = uStack_220;
          type_00._reader.capTable = (CapTableReader *)local_1e0._48_8_;
          type_00._reader.segment = (SegmentReader *)local_1e0._40_8_;
          type_00._reader.data = (void *)local_1e0._56_8_;
          type_00._reader.pointers = (WirePointer *)local_1e0._64_8_;
          type_00._reader.dataSize = local_1e0._72_4_;
          type_00._reader.pointerCount = local_1e0._76_2_;
          type_00._reader._38_2_ = local_1e0._78_2_;
          type_00._reader._40_8_ = local_1e0._80_8_;
          target_01._builder.capTable = local_208.capTable;
          target_01._builder.segment = local_208.segment;
          target_01._builder.data = local_208.data;
          target_01._builder.pointers = local_208.pointers;
          target_01._builder.dataSize = local_208.dataSize;
          target_01._builder.pointerCount = local_208.pointerCount;
          target_01._builder._38_2_ = local_208._38_2_;
          compileBootstrapValue(pNVar23,source,type_00,target_01,&local_218);
        }
        *(byte *)&local_328[2].offsetAndKind.value = (byte)local_328[2].offsetAndKind.value | 1;
      }
      else {
        capnp::_::StructBuilder::asReader(&local_318);
        local_378.data = pWVar10 + 3;
        local_378.segment = &pSVar8->super_SegmentReader;
        local_378.capTable = &pCVar9->super_CapTableReader;
        pNVar23 = (NodeTranslator *)&local_e0;
        capnp::_::PointerBuilder::initStruct
                  ((StructBuilder *)pNVar23,(PointerBuilder *)&local_378,(StructSize)0x10002);
        pSVar15 = (StructReader *)(local_b8 + 0x28);
        pSVar17 = &local_e0;
LAB_0016b87c:
        compileDefaultDefaultValue(pNVar23,(Reader)*pSVar15,(Builder)*pSVar17);
      }
      switch((short)((WireValue<uint32_t> *)local_318.data)->value) {
      case 1:
        uVar22 = 0;
        break;
      case 2:
      case 6:
        uVar22 = 3;
        break;
      case 3:
      case 7:
      case 0xf:
        uVar22 = 4;
        break;
      case 4:
      case 8:
      case 10:
        uVar22 = 5;
        break;
      case 5:
      case 9:
      case 0xb:
        uVar22 = 6;
        break;
      case 0xc:
      case 0xd:
      case 0xe:
      case 0x10:
      case 0x11:
      case 0x12:
        uVar14 = (*(code *)((pMVar2->field_21).unionScope)->parent[2]._vptr_StructOrGroup)();
        goto LAB_0016baf5;
      default:
        uVar14 = 0;
        (*(code *)((pMVar2->field_21).unionScope)->parent->_vptr_StructOrGroup)();
        goto LAB_0016baf5;
      }
      uVar14 = (*(code *)((pMVar2->field_21).unionScope)->parent[1]._vptr_StructOrGroup)
                         ((pMVar2->field_21).unionScope,uVar22);
LAB_0016baf5:
      (local_328->field_1).upper32Bits = uVar14;
LAB_0016bb09:
      kj::_::Debug::Context::~Context((Context *)local_298);
      p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
    } while (p_Var16 != local_2a0);
  }
  MemberInfo::finishGroup(local_2b0);
  ppMVar19 = (this->allMembers).builder.ptr;
  ppMVar5 = (this->allMembers).builder.pos;
  if (ppMVar19 != ppMVar5) {
    do {
      pMVar2 = *ppMVar19;
      pcVar20 = "targetsParam";
      if (pMVar2->isParam == false) {
        WVar1 = pMVar2->declKind;
        pcVar20 = "targetsField";
        if (WVar1 != FIELD) {
          pcVar20 = "targetsUnion";
          if (WVar1 != UNION) {
            if (WVar1 != GROUP) {
              kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                        ((Fault *)local_298,
                         "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                         ,0x5e9,FAILED,(char *)0x0,"\"Unexpected member type.\"",
                         (char (*) [24])"Unexpected member type.");
              kj::_::Debug::Fault::fatal((Fault *)local_298);
            }
            pcVar20 = "targetsGroup";
          }
          MemberInfo::finishGroup(pMVar2);
        }
      }
      MemberInfo::getSchema((Builder *)local_298,pMVar2);
      targetsFlagName.content.size_ = 0xd;
      targetsFlagName.content.ptr = pcVar20;
      compileAnnotationApplications
                ((Orphan<capnp::List<capnp::schema::Annotation,_(capnp::Kind)3>_> *)&local_378,
                 this->translator,(Reader)(pMVar2->declAnnotations).reader,targetsFlagName);
      local_2e8._builder.data = local_280 + 1;
      local_2e8._builder.segment = (SegmentBuilder *)local_298._0_8_;
      local_2e8._builder.capTable = (CapTableBuilder *)local_298._8_8_;
      capnp::_::PointerBuilder::adopt((PointerBuilder *)&local_2e8,(OrphanBuilder *)&local_378);
      if ((ExceptionCallback *)local_378.capTable != (ExceptionCallback *)0x0) {
        capnp::_::OrphanBuilder::euthanize((OrphanBuilder *)&local_378);
      }
      ppMVar19 = ppMVar19 + 1;
    } while (ppMVar19 != ppMVar5);
  }
  pvVar11 = local_2b8;
  *(short *)((long)local_2b8 + 0xe) = (short)(this->layout).top.dataWordCount;
  *(short *)((long)local_2b8 + 0x18) = (short)(this->layout).top.pointerCount;
  *(undefined2 *)((long)local_2b8 + 0x1a) = 7;
  this_00 = (this->translator->groups).builder.ptr;
  pAVar6 = (this->translator->groups).builder.pos;
  if (this_00 != pAVar6) {
    do {
      capnp::_::OrphanBuilder::asStruct
                ((StructBuilder *)local_298,(OrphanBuilder *)this_00,(StructSize)0x60006);
      (((WirePointer *)(local_298._16_8_ + 8))->field_1).structRef.ptrCount.value =
           *(unsigned_short *)((long)pvVar11 + 0xe);
      (((WirePointer *)(local_298._16_8_ + 0x18))->offsetAndKind).value =
           *(uint *)((long)pvVar11 + 0x18);
      this_00 = this_00 + 1;
    } while (this_00 != pAVar6);
  }
  return;
}

Assistant:

void translateInternal(MemberInfo& root, schema::Node::Builder builder) {
    auto structBuilder = builder.initStruct();

    // Go through each member in ordinal order, building each member schema.
    DuplicateOrdinalDetector dupDetector(errorReporter);
    for (auto& entry: membersByOrdinal) {
      MemberInfo& member = *entry.second;

      // Make sure the exceptions added relating to
      // https://github.com/capnproto/capnproto/issues/344 identify the affected field.
      KJ_CONTEXT(member.name);

      if (member.declId.isOrdinal()) {
        dupDetector.check(member.declId.getOrdinal());
      }

      schema::Field::Builder fieldBuilder = member.getSchema();
      fieldBuilder.getOrdinal().setExplicit(entry.first);

      switch (member.declKind) {
        case Declaration::FIELD: {
          auto slot = fieldBuilder.initSlot();
          auto typeBuilder = slot.initType();
          if (translator.compileType(member.fieldType, typeBuilder, implicitMethodParams)) {
            if (member.hasDefaultValue) {
              if (member.isParam &&
                  member.fieldDefaultValue.isRelativeName() &&
                  member.fieldDefaultValue.getRelativeName().getValue() == "null") {
                // special case: parameter set null
                switch (typeBuilder.which()) {
                  case schema::Type::TEXT:
                  case schema::Type::DATA:
                  case schema::Type::LIST:
                  case schema::Type::STRUCT:
                  case schema::Type::INTERFACE:
                  case schema::Type::ANY_POINTER:
                    break;
                  default:
                    errorReporter.addErrorOn(member.fieldDefaultValue.getRelativeName(),
                        "Only pointer parameters can declare their default as 'null'.");
                    break;
                }
                translator.compileDefaultDefaultValue(typeBuilder, slot.initDefaultValue());
              } else {
                translator.compileBootstrapValue(member.fieldDefaultValue,
                                                 typeBuilder, slot.initDefaultValue());
              }
              slot.setHadExplicitDefault(true);
            } else {
              translator.compileDefaultDefaultValue(typeBuilder, slot.initDefaultValue());
            }
          } else {
            translator.compileDefaultDefaultValue(typeBuilder, slot.initDefaultValue());
          }

          int lgSize = -1;
          switch (typeBuilder.which()) {
            case schema::Type::VOID: lgSize = -1; break;
            case schema::Type::BOOL: lgSize = 0; break;
            case schema::Type::INT8: lgSize = 3; break;
            case schema::Type::INT16: lgSize = 4; break;
            case schema::Type::INT32: lgSize = 5; break;
            case schema::Type::INT64: lgSize = 6; break;
            case schema::Type::UINT8: lgSize = 3; break;
            case schema::Type::UINT16: lgSize = 4; break;
            case schema::Type::UINT32: lgSize = 5; break;
            case schema::Type::UINT64: lgSize = 6; break;
            case schema::Type::FLOAT32: lgSize = 5; break;
            case schema::Type::FLOAT64: lgSize = 6; break;

            case schema::Type::TEXT: lgSize = -2; break;
            case schema::Type::DATA: lgSize = -2; break;
            case schema::Type::LIST: lgSize = -2; break;
            case schema::Type::ENUM: lgSize = 4; break;
            case schema::Type::STRUCT: lgSize = -2; break;
            case schema::Type::INTERFACE: lgSize = -2; break;
            case schema::Type::ANY_POINTER: lgSize = -2; break;
          }

          if (lgSize == -2) {
            // pointer
            slot.setOffset(member.fieldScope->addPointer());
          } else if (lgSize == -1) {
            // void
            member.fieldScope->addVoid();
            slot.setOffset(0);
          } else {
            slot.setOffset(member.fieldScope->addData(lgSize));
          }
          break;
        }

        case Declaration::UNION:
          if (!member.unionScope->addDiscriminant()) {
            errorReporter.addErrorOn(member.declId.getOrdinal(),
                "Union ordinal, if specified, must be greater than no more than one of its "
                "member ordinals (i.e. there can only be one field retroactively unionized).");
          }
          break;

        case Declaration::GROUP:
          KJ_FAIL_ASSERT("Groups don't have ordinals.");
          break;

        default:
          KJ_FAIL_ASSERT("Unexpected member type.");
          break;
      }
    }

    // OK, we should have built all the members.  Now go through and make sure the discriminant
    // offsets have been copied over to the schemas and annotations have been applied.
    root.finishGroup();
    for (auto member: allMembers) {
      kj::StringPtr targetsFlagName;
      if (member->isParam) {
        targetsFlagName = "targetsParam";
      } else {
        switch (member->declKind) {
          case Declaration::FIELD:
            targetsFlagName = "targetsField";
            break;

          case Declaration::UNION:
            member->finishGroup();
            targetsFlagName = "targetsUnion";
            break;

          case Declaration::GROUP:
            member->finishGroup();
            targetsFlagName = "targetsGroup";
            break;

          default:
            KJ_FAIL_ASSERT("Unexpected member type.");
            break;
        }
      }

      member->getSchema().adoptAnnotations(translator.compileAnnotationApplications(
          member->declAnnotations, targetsFlagName));
    }

    // And fill in the sizes.
    structBuilder.setDataWordCount(layout.getTop().dataWordCount);
    structBuilder.setPointerCount(layout.getTop().pointerCount);
    structBuilder.setPreferredListEncoding(schema::ElementSize::INLINE_COMPOSITE);

    for (auto& group: translator.groups) {
      auto groupBuilder = group.node.get().getStruct();
      groupBuilder.setDataWordCount(structBuilder.getDataWordCount());
      groupBuilder.setPointerCount(structBuilder.getPointerCount());
      groupBuilder.setPreferredListEncoding(structBuilder.getPreferredListEncoding());
    }
  }